

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix3d * tinyusdz::inverse(matrix3d *__return_storage_ptr__,matrix3d *_m)

{
  long lVar1;
  long lVar2;
  mat<double,_3,_3> *in_RDX;
  matrix33d *pmVar3;
  linalg *plVar4;
  matrix3d *pmVar5;
  byte bVar6;
  matrix33d inv_m;
  linalg local_60 [72];
  
  bVar6 = 0;
  lVar2 = 9;
  plVar4 = local_60;
  for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(double *)plVar4 = *(double *)_m;
    _m = (matrix3d *)((long)_m + 8);
    plVar4 = plVar4 + 8;
  }
  linalg::inverse<double,3>(&inv_m,local_60,in_RDX);
  pmVar3 = &inv_m;
  pmVar5 = __return_storage_ptr__;
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    pmVar5->m[0][0] = *(double *)pmVar3;
    pmVar3 = (matrix33d *)((long)pmVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    pmVar5 = (matrix3d *)((long)pmVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d inverse(const value::matrix3d &_m) {
  matrix33d m;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 3 * 3);

  matrix33d inv_m = linalg::inverse(m);

  value::matrix3d outm;

  memcpy(outm.m, &inv_m[0][0], sizeof(double) * 3 * 3);

  return outm;
}